

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O1

ValueLength arangodb::velocypack::Collection::indexOf(Slice slice,Slice other)

{
  bool bVar1;
  ValueLength VVar2;
  ArrayIterator it;
  uint8_t *local_58;
  uint8_t *local_50;
  ArrayIterator local_48;
  
  local_50 = other._start;
  ArrayIterator::ArrayIterator(&local_48,slice);
  if (local_48._position != local_48._size) {
    VVar2 = 0;
    do {
      local_58 = (uint8_t *)ArrayIterator::value(&local_48);
      bVar1 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
              binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                        ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                         &local_58,
                         (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_50);
      if (bVar1) {
        return VVar2;
      }
      ArrayIterator::next(&local_48);
      VVar2 = VVar2 + 1;
    } while (local_48._position != local_48._size);
  }
  return 0xffffffffffffffff;
}

Assistant:

ValueLength Collection::indexOf(Slice slice, Slice other) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    if (it.value().binaryEquals(other)) {
      return index;
    }
    it.next();
    ++index;
  }

  return Collection::NotFound;
}